

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O0

void stat_sprint_scope(nni_stat *stat,char **scope,int *lenp)

{
  size_t sVar1;
  int *lenp_local;
  char **scope_local;
  nni_stat *stat_local;
  
  if (stat->s_parent != (nni_stat *)0x0) {
    stat_sprint_scope(stat->s_parent,scope,lenp);
  }
  sVar1 = strlen(stat->s_info->si_name);
  if (sVar1 == 0) {
    **scope = '\0';
  }
  else {
    snprintf(*scope,(long)*lenp,"%s#%d.",stat->s_info->si_name,(ulong)(uint)(stat->s_val).sv_id);
  }
  sVar1 = strlen(*scope);
  *lenp = *lenp - (int)sVar1;
  sVar1 = strlen(*scope);
  *scope = *scope + sVar1;
  return;
}

Assistant:

void
stat_sprint_scope(const nni_stat *stat, char **scope, int *lenp)
{
	if (stat->s_parent != NULL) {
		stat_sprint_scope(stat->s_parent, scope, lenp);
	}
	if (strlen(stat->s_info->si_name) > 0) {
		snprintf(*scope, *lenp, "%s#%d.", stat->s_info->si_name,
		    stat->s_val.sv_id);
	} else {
		(*scope)[0] = '\0';
	}
	*lenp -= (int) strlen(*scope);
	*scope += strlen(*scope);
}